

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaSetParserStructuredErrors
               (xmlSchemaParserCtxtPtr ctxt,xmlStructuredErrorFunc serror,void *ctx)

{
  xmlSchemaValidCtxtPtr pxVar1;
  
  while( true ) {
    if (ctxt == (xmlSchemaParserCtxtPtr)0x0) {
      return;
    }
    ctxt->serror = serror;
    ctxt->errCtxt = ctx;
    pxVar1 = ctxt->vctxt;
    if (pxVar1 == (xmlSchemaValidCtxtPtr)0x0) break;
    pxVar1->serror = serror;
    pxVar1->error = (xmlSchemaValidityErrorFunc)0x0;
    pxVar1->warning = (xmlSchemaValidityWarningFunc)0x0;
    pxVar1->errCtxt = ctx;
    ctxt = pxVar1->pctxt;
    if (ctxt == (xmlSchemaParserCtxtPtr)0x0) {
      return;
    }
  }
  return;
}

Assistant:

void
xmlSchemaSetParserStructuredErrors(xmlSchemaParserCtxtPtr ctxt,
				   xmlStructuredErrorFunc serror,
				   void *ctx)
{
    if (ctxt == NULL)
	return;
    ctxt->serror = serror;
    ctxt->errCtxt = ctx;
    if (ctxt->vctxt != NULL)
	xmlSchemaSetValidStructuredErrors(ctxt->vctxt, serror, ctx);
}